

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

ostream * rlib::operator<<(ostream *os,JsonT<void> *json)

{
  Stringify local_88;
  Format local_78;
  
  JsonT<void>::Stringify::Format::Format(&local_78);
  local_88.json = json;
  local_88.format = &local_78;
  operator<<(os,&local_88);
  JsonT<void>::Stringify::Format::~Format(&local_78);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const JsonT& json) {
			os << Stringify(json, typename Stringify::Format());
			return os;
		}